

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expressiontoken.cpp
# Opt level: O0

bool __thiscall PDA::Transducer::ExpressionToken::isOperation(ExpressionToken *this)

{
  ExpressionToken *this_local;
  
  if ((((this->m_charToken == L'-') || (this->m_charToken == L'+')) || (this->m_charToken == L'/'))
     || ((this->m_charToken == L'*' || (this->m_charToken == L'%')))) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ExpressionToken::isOperation() const
{
    if (m_charToken == L'-' || m_charToken == L'+' || m_charToken == L'/' || m_charToken == L'*' || m_charToken == L'%')
        return true;
    else
        return false;
}